

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tp_linear.hpp
# Opt level: O3

vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_> *
sisl::tp_linear::get_integer_support<3>(void)

{
  undefined8 *puVar1;
  pointer pMVar2;
  undefined8 *puVar3;
  int *piVar4;
  void *pvVar5;
  undefined8 *puVar6;
  char *__function;
  DenseStorage<int,__1,__1,_1,_0> *other;
  vector<Eigen::Matrix<int,_1,1,0,_1,1>,std::allocator<Eigen::Matrix<int,_1,1,0,_1,1>>> *in_RDI;
  long lVar7;
  lattice_site po;
  lattice_site zero;
  Matrix<int,__1,_1,_0,__1,_1> l;
  void *local_b8;
  long lStack_b0;
  value_type local_a8;
  long local_90;
  vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
  local_88;
  void *local_70 [2];
  DenseStorage<int,__1,__1,_1,_0> local_60;
  undefined8 *local_50;
  DenseStorage<int,__1,__1,_1,_0> *local_48;
  void **local_40;
  
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  local_88.
  super__Vector_base<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data = (int *)0x0
  ;
  local_a8.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  piVar4 = (int *)malloc(0xc);
  if (piVar4 == (int *)0x0) {
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = operator_delete;
    __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_a8.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 3;
  local_b8 = (void *)0x0;
  lStack_b0 = 0;
  local_a8.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data = piVar4;
  pvVar5 = calloc(1,0xc);
  if (pvVar5 == (void *)0x0) {
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = operator_delete;
    __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  lStack_b0 = 3;
  piVar4[2] = 0;
  piVar4[0] = 0;
  piVar4[1] = 0;
  local_b8 = pvVar5;
  std::
  vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
  ::push_back(&local_88,&local_a8);
  lVar7 = 0;
  while( true ) {
    puVar6 = *(undefined8 **)in_RDI;
    puVar1 = *(undefined8 **)(in_RDI + 8);
    local_90 = lVar7;
    puVar3 = puVar6;
    if (puVar1 != puVar6) {
      do {
        local_50 = puVar3;
        free((void *)*puVar6);
        puVar6 = puVar6 + 2;
        puVar3 = local_50;
      } while (puVar6 != puVar1);
      *(undefined8 **)(in_RDI + 8) = local_50;
    }
    pMVar2 = local_88.
             super__Vector_base<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (lStack_b0 <= local_90) break;
    *(undefined4 *)((long)local_b8 + local_90 * 4) = 1;
    for (other = (DenseStorage<int,__1,__1,_1,_0> *)
                 local_88.
                 super__Vector_base<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; lVar7 = local_90,
        other != (DenseStorage<int,__1,__1,_1,_0> *)pMVar2; other = other + 1) {
      Eigen::DenseStorage<int,_-1,_-1,_1,_0>::DenseStorage(&local_60,other);
      if (local_60.m_rows != lStack_b0) {
        __function = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int>, const Eigen::Matrix<int, -1, 1>, const Eigen::Matrix<int, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<int>, Lhs = const Eigen::Matrix<int, -1, 1>, Rhs = const Eigen::Matrix<int, -1, 1>]"
        ;
LAB_00146aac:
        local_40 = &local_b8;
        local_48 = &local_60;
        __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,__function);
      }
      local_48 = &local_60;
      local_40 = &local_b8;
      Eigen::PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>>
                ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_70,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                  *)&local_48);
      std::vector<Eigen::Matrix<int,-1,1,0,-1,1>,std::allocator<Eigen::Matrix<int,-1,1,0,-1,1>>>::
      emplace_back<Eigen::Matrix<int,_1,1,0,_1,1>>(in_RDI,(Matrix<int,__1,_1,_0,__1,_1> *)local_70);
      free(local_70[0]);
      std::
      vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
      ::push_back((vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                   *)in_RDI,(value_type *)&local_60);
      if (local_60.m_rows != lStack_b0) {
        __function = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<int>, const Eigen::Matrix<int, -1, 1>, const Eigen::Matrix<int, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<int>, Lhs = const Eigen::Matrix<int, -1, 1>, Rhs = const Eigen::Matrix<int, -1, 1>]"
        ;
        goto LAB_00146aac;
      }
      local_48 = &local_60;
      local_40 = &local_b8;
      Eigen::PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>>
                ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_70,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                  *)&local_48);
      std::vector<Eigen::Matrix<int,-1,1,0,-1,1>,std::allocator<Eigen::Matrix<int,-1,1,0,-1,1>>>::
      emplace_back<Eigen::Matrix<int,_1,1,0,_1,1>>(in_RDI,(Matrix<int,__1,_1,_0,__1,_1> *)local_70);
      free(local_70[0]);
      free(local_60.m_data);
    }
    if (lStack_b0 <= local_90) break;
    *(undefined4 *)((long)local_b8 + local_90 * 4) = 0;
    std::
    vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
    ::operator=(&local_88,
                (vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                 *)in_RDI);
    lVar7 = lVar7 + 1;
    if (lVar7 == 3) {
      free(local_b8);
      free(local_a8.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data);
      std::
      vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
      ::~vector(&local_88);
      return (vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
              *)in_RDI;
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x19a,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<int, -1, 1>, Level = 1]"
               );
}

Assistant:

static std::vector<lattice_site> get_integer_support() {
            // Poor man's cartesian product :x
            std::vector<lattice_site> ret = {}, tret = {};
            lattice_site zero(N), po(N);
            zero.setZero();
            po.setZero();
            tret.push_back(zero);

            for(int i = 0; i < N; i++) {
                ret.clear();
                po[i] = 1;
                for(auto l : tret) {
                    ret.push_back(l + po);
                    ret.push_back(l);
                    ret.push_back(l - po);
                }
                po[i] = 0;
                tret = ret;
            }
            return ret;
        }